

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

char * __thiscall btSoftBody::serialize(btSoftBody *this,void *dataBuffer,btSerializer *serializer)

{
  int iVar1;
  int iVar2;
  Material **ppMVar3;
  long lVar4;
  Node *pNVar5;
  Link *pLVar6;
  Node *pNVar7;
  Face *pFVar8;
  Tetra *pTVar9;
  Anchor *pAVar10;
  undefined8 uVar11;
  btVector3 *pbVar12;
  float *pfVar13;
  Cluster **ppCVar14;
  Node **ppNVar15;
  Joint **ppJVar16;
  btHashMap<btHashPtr,_int> *in_RDX;
  long in_RSI;
  long in_RDI;
  int j_5;
  int i_9;
  btSoftBodyJointData *memPtr_14;
  btChunk *chunk_14;
  int numElem_12;
  int sz_13;
  int *indexPtr;
  int j_4;
  int *memPtr_13;
  btChunk *chunk_13;
  int sz_12;
  int numElem_11;
  int j_3;
  float *memPtr_12;
  btChunk *chunk_12;
  int sz_11;
  int numElem_10;
  int j_2;
  btVector3FloatData *memPtr_11;
  btChunk *chunk_11;
  int sz_10;
  int numElem_9;
  int i_8;
  SoftBodyClusterData *memPtr_10;
  btChunk *chunk_10;
  int sz_9;
  int numElem_8;
  int i_7;
  float *memPtr_9;
  btChunk *chunk_9;
  int sz_8;
  int numElem_7;
  int i_6;
  btVector3FloatData *memPtr_8;
  btChunk *chunk_8;
  int sz_7;
  int numElem_6;
  SoftBodyPoseData *memPtr_7;
  btChunk *chunk_7;
  int sz_6;
  int i_5;
  SoftRigidAnchorData *memPtr_6;
  btChunk *chunk_6;
  int numElem_5;
  int sz_5;
  int j_1;
  int i_4;
  SoftBodyTetraData *memPtr_5;
  btChunk *chunk_5;
  int numElem_4;
  int sz_4;
  int j;
  int i_3;
  SoftBodyFaceData *memPtr_4;
  btChunk *chunk_4;
  int numElem_3;
  int sz_3;
  int i_2;
  SoftBodyLinkData *memPtr_3;
  btChunk *chunk_3;
  int numElem_2;
  int sz_2;
  int i_1;
  SoftBodyNodeData *memPtr_2;
  btChunk *chunk_2;
  int numElem_1;
  int sz_1;
  SoftBodyMaterialData *memPtr_1;
  btChunk *chunk_1;
  Material *mat;
  int i;
  SoftBodyMaterialData **memPtr;
  btChunk *chunk;
  int numElem;
  int sz;
  btHashMap<btHashPtr,_int> m_nodeIndexMap;
  btSoftBodyFloatData *sbd;
  btTransformFloatData *in_stack_fffffffffffff548;
  btHashMap<btHashPtr,_int> *in_stack_fffffffffffff550;
  btHashMap<btHashPtr,_int> *in_stack_fffffffffffff558;
  btSerializer *in_stack_fffffffffffff560;
  void *in_stack_fffffffffffff568;
  btCollisionObject *in_stack_fffffffffffff570;
  btHashMap<btHashPtr,_int> *pbVar17;
  btHashPtr *in_stack_fffffffffffff578;
  btHashMap<btHashPtr,_int> *in_stack_fffffffffffff580;
  undefined8 local_988;
  undefined8 local_910;
  undefined8 local_8b8;
  undefined8 local_858;
  undefined8 local_730;
  undefined8 local_6e0;
  undefined8 local_690;
  undefined8 local_640;
  undefined4 local_618;
  undefined8 local_5c8;
  undefined8 local_580;
  undefined4 local_548;
  undefined8 local_510;
  float local_4c8;
  undefined8 local_498;
  undefined8 local_468;
  undefined4 local_420;
  undefined4 local_3f8;
  undefined8 local_3d0;
  undefined8 local_398;
  undefined8 local_348;
  undefined8 local_2f8;
  undefined8 local_2d0;
  undefined8 local_2b0;
  int local_290;
  int local_28c;
  undefined8 *local_288;
  btHashPtr local_270;
  int *local_268;
  int local_25c;
  int *local_258;
  long local_250;
  undefined4 local_244;
  int local_240;
  int local_23c;
  float *local_238;
  long local_230;
  undefined4 local_224;
  int local_220;
  int local_21c;
  btVector3FloatData *local_218;
  long local_210;
  undefined4 local_204;
  int local_200;
  int local_1fc;
  long local_1f8;
  long local_1f0;
  undefined4 local_1e4;
  int local_1e0;
  int local_1dc;
  float *local_1d8;
  long local_1d0;
  undefined4 local_1c4;
  int local_1c0;
  int local_1bc;
  btVector3FloatData *local_1b8;
  long local_1b0;
  undefined4 local_1a8;
  int local_1a4;
  long local_1a0;
  long local_198;
  undefined4 local_190;
  int local_18c;
  long local_188;
  long local_180;
  int local_178;
  undefined4 local_174;
  int local_170;
  int local_16c;
  long local_168;
  long local_160;
  int local_158;
  undefined4 local_154;
  int local_150;
  int local_14c;
  float *local_148;
  long local_140;
  int local_134;
  undefined4 local_130;
  int local_12c;
  undefined8 *local_128;
  long local_120;
  int local_118;
  undefined4 local_114;
  btHashPtr local_110;
  int local_104;
  undefined8 *local_100;
  long local_f8;
  int local_f0;
  undefined4 local_ec;
  btScalar *local_e8;
  long local_e0;
  Material *local_d8;
  int local_cc;
  undefined8 *local_c8;
  long local_c0;
  int local_b4;
  undefined4 local_b0;
  long local_20;
  btHashMap<btHashPtr,_int> *local_18;
  
  local_20 = in_RSI;
  local_18 = in_RDX;
  btCollisionObject::serialize
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  btHashMap<btHashPtr,_int>::btHashMap((btHashMap<btHashPtr,_int> *)in_stack_fffffffffffff570);
  iVar1 = btAlignedObjectArray<btSoftBody::Material_*>::size
                    ((btAlignedObjectArray<btSoftBody::Material_*> *)(in_RDI + 0x470));
  *(int *)(local_20 + 0x158) = iVar1;
  if (*(int *)(local_20 + 0x158) == 0) {
    local_2b0 = 0;
  }
  else {
    local_2b0 = (**(code **)(*(long *)&local_18->m_hashTable + 0x38))();
  }
  *(undefined8 *)(local_20 + 0x118) = local_2b0;
  if (*(long *)(local_20 + 0x118) != 0) {
    local_b0 = 8;
    local_b4 = *(int *)(local_20 + 0x158);
    local_c0 = (**(code **)(*(long *)&local_18->m_hashTable + 0x20))(local_18,8,local_b4);
    local_c8 = *(undefined8 **)(local_c0 + 8);
    for (local_cc = 0; local_cc < local_b4; local_cc = local_cc + 1) {
      ppMVar3 = btAlignedObjectArray<btSoftBody::Material_*>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Material_*> *)(in_RDI + 0x470),local_cc
                          );
      local_d8 = *ppMVar3;
      if (local_d8 == (Material *)0x0) {
        local_2d0 = 0;
      }
      else {
        local_2d0 = (**(code **)(*(long *)&local_18->m_hashTable + 0x38))(local_18,local_d8);
      }
      *local_c8 = local_2d0;
      lVar4 = (**(code **)(*(long *)&local_18->m_hashTable + 0x30))(local_18,local_d8);
      if (lVar4 == 0) {
        local_e0 = (**(code **)(*(long *)&local_18->m_hashTable + 0x20))(local_18,0x10,1);
        local_e8 = *(btScalar **)(local_e0 + 8);
        local_e8[3] = (btScalar)local_d8->m_flags;
        local_e8[1] = local_d8->m_kAST;
        *local_e8 = local_d8->m_kLST;
        local_e8[2] = local_d8->m_kVST;
        (**(code **)(*(long *)&local_18->m_hashTable + 0x28))
                  (local_18,local_e0,"SoftBodyMaterialData",0x544d4253,local_d8);
      }
      local_c8 = local_c8 + 1;
    }
    (**(code **)(*(long *)&local_18->m_hashTable + 0x28))
              (local_18,local_c0,"SoftBodyMaterialData",0x59415241,in_RDI + 0x470);
  }
  iVar1 = btAlignedObjectArray<btSoftBody::Node>::size
                    ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
  *(int *)(local_20 + 0x15c) = iVar1;
  if (*(int *)(local_20 + 0x15c) == 0) {
    local_2f8 = 0;
  }
  else {
    local_2f8 = (**(code **)(*(long *)&local_18->m_hashTable + 0x38))();
  }
  *(undefined8 *)(local_20 + 0x120) = local_2f8;
  if (*(long *)(local_20 + 0x120) != 0) {
    local_ec = 0x68;
    local_f0 = *(int *)(local_20 + 0x15c);
    local_f8 = (**(code **)(*(long *)&local_18->m_hashTable + 0x20))(local_18,0x68,local_f0);
    local_100 = *(undefined8 **)(local_f8 + 8);
    for (local_104 = 0; local_104 < local_f0; local_104 = local_104 + 1) {
      pNVar5 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_104);
      btVector3::serializeFloat(&pNVar5->m_f,(btVector3FloatData *)(local_100 + 7));
      pNVar5 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_104);
      *(btScalar *)((long)local_100 + 0x5c) = pNVar5->m_area;
      pNVar5 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_104);
      *(uint *)(local_100 + 0xc) = -((byte)pNVar5->field_0x70 & 1);
      pNVar5 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_104);
      *(btScalar *)(local_100 + 0xb) = pNVar5->m_im;
      pNVar5 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_104);
      pbVar17 = local_18;
      if ((pNVar5->super_Feature).m_material == (Material *)0x0) {
        local_348 = 0;
      }
      else {
        pNVar5 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_104);
        local_348 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))
                              (pbVar17,(pNVar5->super_Feature).m_material);
      }
      *local_100 = local_348;
      pNVar5 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_104);
      btVector3::serializeFloat(&pNVar5->m_n,(btVector3FloatData *)(local_100 + 9));
      pNVar5 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_104);
      btVector3::serializeFloat(&pNVar5->m_x,(btVector3FloatData *)(local_100 + 1));
      pNVar5 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_104);
      btVector3::serializeFloat(&pNVar5->m_q,(btVector3FloatData *)(local_100 + 3));
      pNVar5 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_104);
      btVector3::serializeFloat(&pNVar5->m_v,(btVector3FloatData *)(local_100 + 5));
      pNVar5 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_104);
      btHashPtr::btHashPtr(&local_110,pNVar5);
      btHashMap<btHashPtr,_int>::insert
                (in_stack_fffffffffffff580,in_stack_fffffffffffff578,
                 (int *)in_stack_fffffffffffff570);
      local_100 = local_100 + 0xd;
    }
    (**(code **)(*(long *)&local_18->m_hashTable + 0x28))
              (local_18,local_f8,"SoftBodyNodeData",0x444e4253,in_RDI + 0x370);
  }
  iVar1 = btAlignedObjectArray<btSoftBody::Link>::size
                    ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390));
  pbVar17 = local_18;
  *(int *)(local_20 + 0x160) = iVar1;
  if (*(int *)(local_20 + 0x160) == 0) {
    local_398 = 0;
  }
  else {
    btAlignedObjectArray<btSoftBody::Link>::operator[]
              ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),0);
    local_398 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))();
  }
  *(undefined8 *)(local_20 + 0x128) = local_398;
  if (*(long *)(local_20 + 0x128) != 0) {
    local_114 = 0x18;
    local_118 = *(int *)(local_20 + 0x160);
    local_120 = (**(code **)(*(long *)&local_18->m_hashTable + 0x20))(local_18,0x18,local_118);
    local_128 = *(undefined8 **)(local_120 + 8);
    for (local_12c = 0; pbVar17 = local_18, lVar4 = local_120, local_12c < local_118;
        local_12c = local_12c + 1) {
      pLVar6 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_12c);
      *(uint *)((long)local_128 + 0x14) = -((byte)pLVar6->field_0x24 & 1);
      pLVar6 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_12c);
      pbVar17 = local_18;
      if ((pLVar6->super_Feature).m_material == (Material *)0x0) {
        local_3d0 = 0;
      }
      else {
        pLVar6 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_12c);
        local_3d0 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))
                              (pbVar17,(pLVar6->super_Feature).m_material);
      }
      *local_128 = local_3d0;
      pLVar6 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_12c);
      if (pLVar6->m_n[0] == (Node *)0x0) {
        local_3f8 = 0xffffffff;
      }
      else {
        pLVar6 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_12c);
        pNVar5 = pLVar6->m_n[0];
        pNVar7 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),0);
        local_3f8 = (undefined4)(((long)pNVar5 - (long)pNVar7) / 0x78);
      }
      *(undefined4 *)(local_128 + 1) = local_3f8;
      pLVar6 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_12c);
      if (pLVar6->m_n[1] == (Node *)0x0) {
        local_420 = 0xffffffff;
      }
      else {
        pLVar6 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_12c);
        pNVar5 = pLVar6->m_n[1];
        pNVar7 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),0);
        local_420 = (undefined4)(((long)pNVar5 - (long)pNVar7) / 0x78);
      }
      *(undefined4 *)((long)local_128 + 0xc) = local_420;
      pLVar6 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_12c);
      *(btScalar *)(local_128 + 2) = pLVar6->m_rl;
      local_128 = local_128 + 3;
    }
    pLVar6 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                       ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),0);
    (**(code **)(*(long *)&pbVar17->m_hashTable + 0x28))
              (pbVar17,lVar4,"SoftBodyLinkData",0x59415241,pLVar6);
  }
  iVar1 = btAlignedObjectArray<btSoftBody::Face>::size
                    ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0));
  pbVar17 = local_18;
  *(int *)(local_20 + 0x164) = iVar1;
  if (*(int *)(local_20 + 0x164) == 0) {
    local_468 = 0;
  }
  else {
    btAlignedObjectArray<btSoftBody::Face>::operator[]
              ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),0);
    local_468 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))();
  }
  *(undefined8 *)(local_20 + 0x130) = local_468;
  if (*(long *)(local_20 + 0x130) != 0) {
    local_130 = 0x28;
    local_134 = *(int *)(local_20 + 0x164);
    local_140 = (**(code **)(*(long *)&local_18->m_hashTable + 0x20))(local_18,0x28,local_134);
    local_148 = *(float **)(local_140 + 8);
    for (local_14c = 0; pbVar17 = local_18, lVar4 = local_140, local_14c < local_134;
        local_14c = local_14c + 1) {
      pFVar8 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),local_14c);
      pbVar17 = local_18;
      if ((pFVar8->super_Feature).m_material == (Material *)0x0) {
        local_498 = 0;
      }
      else {
        pFVar8 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),local_14c);
        local_498 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))
                              (pbVar17,(pFVar8->super_Feature).m_material);
      }
      *(undefined8 *)(local_148 + 4) = local_498;
      pFVar8 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),local_14c);
      btVector3::serializeFloat(&pFVar8->m_normal,(btVector3FloatData *)local_148);
      for (local_150 = 0; local_150 < 3; local_150 = local_150 + 1) {
        pFVar8 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),local_14c);
        if (pFVar8->m_n[local_150] == (Node *)0x0) {
          local_4c8 = -NAN;
        }
        else {
          pFVar8 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),local_14c);
          pNVar5 = pFVar8->m_n[local_150];
          pNVar7 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),0);
          local_4c8 = (float)(((long)pNVar5 - (long)pNVar7) / 0x78);
        }
        ((btVector3FloatData *)((long)local_148 + 0x10))->m_floats[(long)local_150 + 2] = local_4c8;
      }
      pFVar8 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),local_14c);
      ((btVector3FloatData *)((long)local_148 + 0x20))->m_floats[1] = pFVar8->m_ra;
      local_148 = ((btVector3FloatData *)((long)local_148 + 0x20))->m_floats + 2;
    }
    pFVar8 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                       ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),0);
    (**(code **)(*(long *)&pbVar17->m_hashTable + 0x28))
              (pbVar17,lVar4,"SoftBodyFaceData",0x59415241,pFVar8);
  }
  iVar1 = btAlignedObjectArray<btSoftBody::Tetra>::size
                    ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0));
  pbVar17 = local_18;
  *(int *)(local_20 + 0x168) = iVar1;
  if (*(int *)(local_20 + 0x168) == 0) {
    local_510 = 0;
  }
  else {
    btAlignedObjectArray<btSoftBody::Tetra>::operator[]
              ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0),0);
    local_510 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))();
  }
  *(undefined8 *)(local_20 + 0x138) = local_510;
  if (*(long *)(local_20 + 0x138) != 0) {
    local_154 = 0x68;
    local_158 = *(int *)(local_20 + 0x168);
    local_160 = (**(code **)(*(long *)&local_18->m_hashTable + 0x20))(local_18,0x68,local_158);
    local_168 = *(long *)(local_160 + 8);
    for (local_16c = 0; pbVar17 = local_18, lVar4 = local_160, local_16c < local_158;
        local_16c = local_16c + 1) {
      for (local_170 = 0; local_170 < 4; local_170 = local_170 + 1) {
        pTVar9 = btAlignedObjectArray<btSoftBody::Tetra>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0),local_16c);
        btVector3::serializeFloat
                  (pTVar9->m_c0 + local_170,
                   (btVector3FloatData *)(local_168 + (long)local_170 * 0x10));
        pTVar9 = btAlignedObjectArray<btSoftBody::Tetra>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0),local_170);
        if (pTVar9->m_n[local_170] == (Node *)0x0) {
          local_548 = 0xffffffff;
        }
        else {
          pTVar9 = btAlignedObjectArray<btSoftBody::Tetra>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0),local_170)
          ;
          pNVar5 = pTVar9->m_n[local_170];
          pNVar7 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),0);
          local_548 = (undefined4)(((long)pNVar5 - (long)pNVar7) / 0x78);
        }
        *(undefined4 *)(local_168 + 0x48 + (long)local_170 * 4) = local_548;
      }
      pTVar9 = btAlignedObjectArray<btSoftBody::Tetra>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0),local_16c);
      *(btScalar *)(local_168 + 0x5c) = pTVar9->m_c1;
      pTVar9 = btAlignedObjectArray<btSoftBody::Tetra>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0),local_16c);
      *(btScalar *)(local_168 + 0x60) = pTVar9->m_c2;
      pTVar9 = btAlignedObjectArray<btSoftBody::Tetra>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0),local_16c);
      pbVar17 = local_18;
      if ((pTVar9->super_Feature).m_material == (Material *)0x0) {
        local_580 = 0;
      }
      else {
        pTVar9 = btAlignedObjectArray<btSoftBody::Tetra>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0),local_16c);
        local_580 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))
                              (pbVar17,(pTVar9->super_Feature).m_material);
      }
      *(undefined8 *)(local_168 + 0x40) = local_580;
      pTVar9 = btAlignedObjectArray<btSoftBody::Tetra>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0),local_16c);
      *(btScalar *)(local_168 + 0x58) = pTVar9->m_rv;
      local_168 = local_168 + 0x68;
    }
    pTVar9 = btAlignedObjectArray<btSoftBody::Tetra>::operator[]
                       ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0),0);
    (**(code **)(*(long *)&pbVar17->m_hashTable + 0x28))
              (pbVar17,lVar4,"SoftBodyTetraData",0x59415241,pTVar9);
  }
  iVar1 = btAlignedObjectArray<btSoftBody::Anchor>::size
                    ((btAlignedObjectArray<btSoftBody::Anchor> *)(in_RDI + 0x3f0));
  pbVar17 = local_18;
  *(int *)(local_20 + 0x16c) = iVar1;
  if (*(int *)(local_20 + 0x16c) == 0) {
    local_5c8 = 0;
  }
  else {
    pAVar10 = btAlignedObjectArray<btSoftBody::Anchor>::operator[]
                        ((btAlignedObjectArray<btSoftBody::Anchor> *)(in_RDI + 0x3f0),0);
    local_5c8 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))(pbVar17,pAVar10);
  }
  *(undefined8 *)(local_20 + 0x140) = local_5c8;
  if (*(long *)(local_20 + 0x140) != 0) {
    local_174 = 0x60;
    local_178 = *(int *)(local_20 + 0x16c);
    local_180 = (**(code **)(*(long *)&local_18->m_hashTable + 0x20))(local_18,0x60,local_178);
    local_188 = *(long *)(local_180 + 8);
    for (local_18c = 0; pbVar17 = local_18, lVar4 = local_180, local_18c < local_178;
        local_18c = local_18c + 1) {
      btAlignedObjectArray<btSoftBody::Anchor>::operator[]
                ((btAlignedObjectArray<btSoftBody::Anchor> *)(in_RDI + 0x3f0),local_18c);
      btMatrix3x3::serializeFloat
                ((btMatrix3x3 *)in_stack_fffffffffffff560,
                 (btMatrix3x3FloatData *)in_stack_fffffffffffff558);
      pAVar10 = btAlignedObjectArray<btSoftBody::Anchor>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Anchor> *)(in_RDI + 0x3f0),local_18c);
      btVector3::serializeFloat(&pAVar10->m_c1,(btVector3FloatData *)(local_188 + 0x30));
      pAVar10 = btAlignedObjectArray<btSoftBody::Anchor>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Anchor> *)(in_RDI + 0x3f0),local_18c);
      *(btScalar *)(local_188 + 0x5c) = pAVar10->m_c2;
      pAVar10 = btAlignedObjectArray<btSoftBody::Anchor>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Anchor> *)(in_RDI + 0x3f0),local_18c);
      btVector3::serializeFloat(&pAVar10->m_local,(btVector3FloatData *)(local_188 + 0x40));
      pAVar10 = btAlignedObjectArray<btSoftBody::Anchor>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Anchor> *)(in_RDI + 0x3f0),local_18c);
      if (pAVar10->m_node == (Node *)0x0) {
        local_618 = 0xffffffff;
      }
      else {
        pAVar10 = btAlignedObjectArray<btSoftBody::Anchor>::operator[]
                            ((btAlignedObjectArray<btSoftBody::Anchor> *)(in_RDI + 0x3f0),local_18c)
        ;
        pNVar5 = pAVar10->m_node;
        pNVar7 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),0);
        local_618 = (undefined4)(((long)pNVar5 - (long)pNVar7) / 0x78);
      }
      *(undefined4 *)(local_188 + 0x58) = local_618;
      pAVar10 = btAlignedObjectArray<btSoftBody::Anchor>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Anchor> *)(in_RDI + 0x3f0),local_18c);
      pbVar17 = local_18;
      if (pAVar10->m_body == (btRigidBody *)0x0) {
        local_640 = 0;
      }
      else {
        btAlignedObjectArray<btSoftBody::Anchor>::operator[]
                  ((btAlignedObjectArray<btSoftBody::Anchor> *)(in_RDI + 0x3f0),local_18c);
        local_640 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))();
      }
      *(undefined8 *)(local_188 + 0x50) = local_640;
      local_188 = local_188 + 0x60;
    }
    pAVar10 = btAlignedObjectArray<btSoftBody::Anchor>::operator[]
                        ((btAlignedObjectArray<btSoftBody::Anchor> *)(in_RDI + 0x3f0),0);
    (**(code **)(*(long *)&pbVar17->m_hashTable + 0x28))
              (pbVar17,lVar4,"SoftRigidAnchorData",0x59415241,pAVar10);
  }
  *(undefined4 *)(local_20 + 0x194) = *(undefined4 *)(in_RDI + 0x194);
  *(undefined4 *)(local_20 + 0x17c) = *(undefined4 *)(in_RDI + 0x17c);
  *(undefined4 *)(local_20 + 0x18c) = *(undefined4 *)(in_RDI + 0x18c);
  *(undefined4 *)(local_20 + 0x178) = *(undefined4 *)(in_RDI + 0x178);
  *(undefined4 *)(local_20 + 0x188) = *(undefined4 *)(in_RDI + 0x188);
  *(undefined4 *)(local_20 + 0x184) = *(undefined4 *)(in_RDI + 0x184);
  *(undefined4 *)(local_20 + 0x1d0) = *(undefined4 *)(in_RDI + 0x1d0);
  *(undefined4 *)(local_20 + 0x1d4) = *(undefined4 *)(in_RDI + 0x1d4);
  *(undefined4 *)(local_20 + 0x1d8) = *(undefined4 *)(in_RDI + 0x1d8);
  *(undefined4 *)(local_20 + 0x1cc) = *(undefined4 *)(in_RDI + 0x1cc);
  *(undefined4 *)(local_20 + 0x1c4) = *(undefined4 *)(in_RDI + 0x1c4);
  *(undefined4 *)(local_20 + 0x180) = *(undefined4 *)(in_RDI + 0x180);
  *(undefined4 *)(local_20 + 0x198) = *(undefined4 *)(in_RDI + 0x198);
  *(undefined4 *)(local_20 + 0x1dc) = *(undefined4 *)(in_RDI + 0x1dc);
  *(undefined4 *)(local_20 + 400) = *(undefined4 *)(in_RDI + 400);
  *(undefined4 *)(local_20 + 0x19c) = *(undefined4 *)(in_RDI + 0x19c);
  *(undefined4 *)(local_20 + 0x1a0) = *(undefined4 *)(in_RDI + 0x1a0);
  *(undefined4 *)(local_20 + 0x1a4) = *(undefined4 *)(in_RDI + 0x1a4);
  *(undefined4 *)(local_20 + 0x1a8) = *(undefined4 *)(in_RDI + 0x1a8);
  *(undefined4 *)(local_20 + 0x1c8) = *(undefined4 *)(in_RDI + 0x1c8);
  *(undefined4 *)(local_20 + 0x1c4) = *(undefined4 *)(in_RDI + 0x1c4);
  *(undefined4 *)(local_20 + 0x1ac) = *(undefined4 *)(in_RDI + 0x1ac);
  *(undefined4 *)(local_20 + 0x1b0) = *(undefined4 *)(in_RDI + 0x1b0);
  *(undefined4 *)(local_20 + 0x1b4) = *(undefined4 *)(in_RDI + 0x1b4);
  *(undefined4 *)(local_20 + 0x1b8) = *(undefined4 *)(in_RDI + 0x1b8);
  *(undefined4 *)(local_20 + 0x1bc) = *(undefined4 *)(in_RDI + 0x1bc);
  *(undefined4 *)(local_20 + 0x1c0) = *(undefined4 *)(in_RDI + 0x1c0);
  uVar11 = (**(code **)(*(long *)&local_18->m_hashTable + 0x38))(local_18,in_RDI + 600);
  *(undefined8 *)(local_20 + 0x110) = uVar11;
  local_190 = 200;
  local_198 = (**(code **)(*(long *)&local_18->m_hashTable + 0x20))(local_18,200,1);
  local_1a0 = *(long *)(local_198 + 8);
  btMatrix3x3::serializeFloat
            ((btMatrix3x3 *)in_stack_fffffffffffff560,
             (btMatrix3x3FloatData *)in_stack_fffffffffffff558);
  *(uint *)(local_1a0 + 0xbc) = *(byte *)(in_RDI + 0x259) & 1;
  *(uint *)(local_1a0 + 0xb8) = *(byte *)(in_RDI + 600) & 1;
  btVector3::serializeFloat((btVector3 *)(in_RDI + 0x2a0),(btVector3FloatData *)(local_1a0 + 0x90));
  iVar1 = btAlignedObjectArray<btVector3>::size((btAlignedObjectArray<btVector3> *)(in_RDI + 0x260))
  ;
  pbVar17 = local_18;
  *(int *)(local_1a0 + 0xb0) = iVar1;
  if (*(int *)(local_1a0 + 0xb0) == 0) {
    local_690 = 0;
  }
  else {
    pbVar12 = btAlignedObjectArray<btVector3>::operator[]
                        ((btAlignedObjectArray<btVector3> *)(in_RDI + 0x260),0);
    local_690 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))(pbVar17,pbVar12);
  }
  *(undefined8 *)(local_1a0 + 0xa0) = local_690;
  if (*(int *)(local_1a0 + 0xb0) != 0) {
    local_1a4 = *(int *)(local_1a0 + 0xb0);
    local_1a8 = 0x10;
    local_1b0 = (**(code **)(*(long *)&local_18->m_hashTable + 0x20))(local_18,0x10,local_1a4);
    local_1b8 = *(btVector3FloatData **)(local_1b0 + 8);
    for (local_1bc = 0; pbVar17 = local_18, lVar4 = local_1b0, local_1bc < local_1a4;
        local_1bc = local_1bc + 1) {
      pbVar12 = btAlignedObjectArray<btVector3>::operator[]
                          ((btAlignedObjectArray<btVector3> *)(in_RDI + 0x260),local_1bc);
      btVector3::serializeFloat(pbVar12,local_1b8);
      local_1b8 = local_1b8 + 1;
    }
    pbVar12 = btAlignedObjectArray<btVector3>::operator[]
                        ((btAlignedObjectArray<btVector3> *)(in_RDI + 0x260),0);
    (**(code **)(*(long *)&pbVar17->m_hashTable + 0x28))
              (pbVar17,lVar4,"btVector3FloatData",0x59415241,pbVar12);
  }
  *(undefined4 *)(local_1a0 + 0xc0) = *(undefined4 *)(in_RDI + 0x25c);
  btMatrix3x3::serializeFloat
            ((btMatrix3x3 *)in_stack_fffffffffffff560,
             (btMatrix3x3FloatData *)in_stack_fffffffffffff558);
  btMatrix3x3::serializeFloat
            ((btMatrix3x3 *)in_stack_fffffffffffff560,
             (btMatrix3x3FloatData *)in_stack_fffffffffffff558);
  iVar1 = btAlignedObjectArray<float>::size((btAlignedObjectArray<float> *)(in_RDI + 0x280));
  pbVar17 = local_18;
  *(int *)(local_1a0 + 0xb4) = iVar1;
  if (*(int *)(local_1a0 + 0xb4) == 0) {
    local_6e0 = 0;
  }
  else {
    pfVar13 = btAlignedObjectArray<float>::operator[]
                        ((btAlignedObjectArray<float> *)(in_RDI + 0x280),0);
    local_6e0 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))(pbVar17,pfVar13);
  }
  *(undefined8 *)(local_1a0 + 0xa8) = local_6e0;
  if (*(int *)(local_1a0 + 0xb4) != 0) {
    local_1c0 = *(int *)(local_1a0 + 0xb4);
    local_1c4 = 4;
    local_1d0 = (**(code **)(*(long *)&local_18->m_hashTable + 0x20))(local_18,4,local_1c0);
    local_1d8 = *(float **)(local_1d0 + 8);
    for (local_1dc = 0; pbVar17 = local_18, lVar4 = local_1d0, local_1dc < local_1c0;
        local_1dc = local_1dc + 1) {
      pfVar13 = btAlignedObjectArray<float>::operator[]
                          ((btAlignedObjectArray<float> *)(in_RDI + 0x280),local_1dc);
      *local_1d8 = *pfVar13;
      local_1d8 = local_1d8 + 1;
    }
    pfVar13 = btAlignedObjectArray<float>::operator[]
                        ((btAlignedObjectArray<float> *)(in_RDI + 0x280),0);
    (**(code **)(*(long *)&pbVar17->m_hashTable + 0x28))(pbVar17,lVar4,"float",0x59415241,pfVar13);
  }
  (**(code **)(*(long *)&local_18->m_hashTable + 0x28))
            (local_18,local_198,"SoftBodyPoseData",0x59415241,in_RDI + 600);
  iVar1 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                    ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8));
  pbVar17 = local_18;
  *(int *)(local_20 + 0x170) = iVar1;
  if (*(int *)(local_20 + 0x170) == 0) {
    local_730 = 0;
  }
  else {
    btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
              ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),0);
    local_730 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))();
  }
  *(undefined8 *)(local_20 + 0x148) = local_730;
  if (*(int *)(local_20 + 0x170) != 0) {
    local_1e0 = *(int *)(local_20 + 0x170);
    local_1e4 = 0x168;
    local_1f0 = (**(code **)(*(long *)&local_18->m_hashTable + 0x20))(local_18,0x168,local_1e0);
    local_1f8 = *(long *)(local_1f0 + 8);
    for (local_1fc = 0; pbVar17 = local_18, lVar4 = local_1f0, local_1fc < local_1e0;
        local_1fc = local_1fc + 1) {
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      *(btScalar *)(local_1f8 + 0x14c) = (*ppCVar14)->m_adamping;
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      btVector3::serializeFloat(&(*ppCVar14)->m_av,(btVector3FloatData *)(local_1f8 + 0x100));
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      *(int *)(local_1f8 + 0x164) = (*ppCVar14)->m_clusterIndex;
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      *(uint *)(local_1f8 + 0x160) = (*ppCVar14)->m_collide & 1;
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      btVector3::serializeFloat(&(*ppCVar14)->m_com,(btVector3FloatData *)(local_1f8 + 0xa0));
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      *(uint *)(local_1f8 + 0x15c) = (*ppCVar14)->m_containsAnchor & 1;
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      btVector3::serializeFloat((*ppCVar14)->m_dimpulses,(btVector3FloatData *)(local_1f8 + 0xd0));
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      btVector3::serializeFloat
                ((*ppCVar14)->m_dimpulses + 1,(btVector3FloatData *)(local_1f8 + 0xe0));
      btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),local_1fc);
      btTransform::serializeFloat
                ((btTransform *)in_stack_fffffffffffff550,in_stack_fffffffffffff548);
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      *(btScalar *)(local_1f8 + 0x134) = (*ppCVar14)->m_idmass;
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      *(btScalar *)(local_1f8 + 0x138) = (*ppCVar14)->m_imass;
      btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),local_1fc);
      btMatrix3x3::serializeFloat
                ((btMatrix3x3 *)in_stack_fffffffffffff560,
                 (btMatrix3x3FloatData *)in_stack_fffffffffffff558);
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      *(btScalar *)(local_1f8 + 0x148) = (*ppCVar14)->m_ldamping;
      btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),local_1fc);
      btMatrix3x3::serializeFloat
                ((btMatrix3x3 *)in_stack_fffffffffffff560,
                 (btMatrix3x3FloatData *)in_stack_fffffffffffff558);
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      btVector3::serializeFloat(&(*ppCVar14)->m_lv,(btVector3FloatData *)(local_1f8 + 0xf0));
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      *(btScalar *)(local_1f8 + 0x150) = (*ppCVar14)->m_matching;
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      *(btScalar *)(local_1f8 + 0x154) = (*ppCVar14)->m_maxSelfCollisionImpulse;
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      *(btScalar *)(local_1f8 + 0x144) = (*ppCVar14)->m_ndamping;
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      *(btScalar *)(local_1f8 + 0x148) = (*ppCVar14)->m_ldamping;
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      *(btScalar *)(local_1f8 + 0x14c) = (*ppCVar14)->m_adamping;
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      *(btScalar *)(local_1f8 + 0x158) = (*ppCVar14)->m_selfCollisionImpulseFactor;
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      iVar1 = btAlignedObjectArray<btVector3>::size(&(*ppCVar14)->m_framerefs);
      *(int *)(local_1f8 + 0x128) = iVar1;
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      iVar1 = btAlignedObjectArray<float>::size(&(*ppCVar14)->m_masses);
      *(int *)(local_1f8 + 0x130) = iVar1;
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      iVar1 = btAlignedObjectArray<btSoftBody::Node_*>::size(&(*ppCVar14)->m_nodes);
      *(int *)(local_1f8 + 300) = iVar1;
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      *(int *)(local_1f8 + 0x13c) = (*ppCVar14)->m_nvimpulses;
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      btVector3::serializeFloat((*ppCVar14)->m_vimpulses,(btVector3FloatData *)(local_1f8 + 0xb0));
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      btVector3::serializeFloat
                ((*ppCVar14)->m_vimpulses + 1,(btVector3FloatData *)(local_1f8 + 0xc0));
      ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                            local_1fc);
      pbVar17 = local_18;
      *(int *)(local_1f8 + 0x140) = (*ppCVar14)->m_ndimpulses;
      if (*(int *)(local_1f8 + 0x128) == 0) {
        local_858 = 0;
      }
      else {
        ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                              local_1fc);
        btAlignedObjectArray<btVector3>::operator[](&(*ppCVar14)->m_framerefs,0);
        local_858 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))();
      }
      *(undefined8 *)(local_1f8 + 0x110) = local_858;
      if (*(long *)(local_1f8 + 0x110) != 0) {
        local_200 = *(int *)(local_1f8 + 0x128);
        local_204 = 0x10;
        local_210 = (**(code **)(*(long *)&local_18->m_hashTable + 0x20))(local_18,0x10,local_200);
        local_218 = *(btVector3FloatData **)(local_210 + 8);
        for (local_21c = 0; pbVar17 = local_18, lVar4 = local_210, local_21c < local_200;
            local_21c = local_21c + 1) {
          ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                               ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                                local_1fc);
          pbVar12 = btAlignedObjectArray<btVector3>::operator[](&(*ppCVar14)->m_framerefs,local_21c)
          ;
          btVector3::serializeFloat(pbVar12,local_218);
          local_218 = local_218 + 1;
        }
        ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                              local_1fc);
        pbVar12 = btAlignedObjectArray<btVector3>::operator[](&(*ppCVar14)->m_framerefs,0);
        (**(code **)(*(long *)&pbVar17->m_hashTable + 0x28))
                  (pbVar17,lVar4,"btVector3FloatData",0x59415241,pbVar12);
      }
      pbVar17 = local_18;
      if (*(int *)(local_1f8 + 0x130) == 0) {
        local_8b8 = 0;
      }
      else {
        ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                              local_1fc);
        btAlignedObjectArray<float>::operator[](&(*ppCVar14)->m_masses,0);
        local_8b8 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))();
      }
      *(undefined8 *)(local_1f8 + 0x120) = local_8b8;
      if (*(long *)(local_1f8 + 0x120) != 0) {
        local_220 = *(int *)(local_1f8 + 0x130);
        local_224 = 4;
        local_230 = (**(code **)(*(long *)&local_18->m_hashTable + 0x20))(local_18,4,local_220);
        local_238 = *(float **)(local_230 + 8);
        for (local_23c = 0; pbVar17 = local_18, lVar4 = local_230, local_23c < local_220;
            local_23c = local_23c + 1) {
          ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                               ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                                local_1fc);
          pfVar13 = btAlignedObjectArray<float>::operator[](&(*ppCVar14)->m_masses,local_23c);
          *local_238 = *pfVar13;
          local_238 = local_238 + 1;
        }
        ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                              local_1fc);
        pfVar13 = btAlignedObjectArray<float>::operator[](&(*ppCVar14)->m_masses,0);
        (**(code **)(*(long *)&pbVar17->m_hashTable + 0x28))
                  (pbVar17,lVar4,"float",0x59415241,pfVar13);
      }
      pbVar17 = local_18;
      if (*(int *)(local_1f8 + 300) == 0) {
        local_910 = 0;
      }
      else {
        btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                  ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),local_1fc);
        local_910 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))();
      }
      *(undefined8 *)(local_1f8 + 0x118) = local_910;
      if (*(long *)(local_1f8 + 0x118) != 0) {
        local_240 = *(int *)(local_1f8 + 0x130);
        local_244 = 4;
        local_250 = (**(code **)(*(long *)&local_18->m_hashTable + 0x20))(local_18,4,local_240);
        local_258 = *(int **)(local_250 + 8);
        for (local_25c = 0; pbVar17 = local_18, lVar4 = local_250, local_25c < local_240;
            local_25c = local_25c + 1) {
          ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                               ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                                local_1fc);
          ppNVar15 = btAlignedObjectArray<btSoftBody::Node_*>::operator[]
                               (&(*ppCVar14)->m_nodes,local_25c);
          btHashPtr::btHashPtr(&local_270,*ppNVar15);
          local_268 = btHashMap<btHashPtr,_int>::find
                                (in_stack_fffffffffffff558,(btHashPtr *)in_stack_fffffffffffff550);
          *local_258 = *local_268;
          local_258 = local_258 + 1;
        }
        ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                              local_1fc);
        (**(code **)(*(long *)&pbVar17->m_hashTable + 0x28))
                  (pbVar17,lVar4,"int",0x59415241,&(*ppCVar14)->m_nodes);
      }
      local_1f8 = local_1f8 + 0x168;
    }
    ppCVar14 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),0);
    (**(code **)(*(long *)&pbVar17->m_hashTable + 0x28))
              (pbVar17,lVar4,"SoftBodyClusterData",0x59415241,*ppCVar14);
  }
  iVar1 = btAlignedObjectArray<btSoftBody::Joint_*>::size
                    ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450));
  *(int *)(local_20 + 0x174) = iVar1;
  iVar1 = btAlignedObjectArray<btSoftBody::Joint_*>::size
                    ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450));
  pbVar17 = local_18;
  if (iVar1 == 0) {
    local_988 = 0;
  }
  else {
    ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),0);
    local_988 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))(pbVar17,ppJVar16);
  }
  *(undefined8 *)(local_20 + 0x150) = local_988;
  if (*(long *)(local_20 + 0x150) != 0) {
    iVar1 = btAlignedObjectArray<btSoftBody::Joint_*>::size
                      ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450));
    lVar4 = (**(code **)(*(long *)&local_18->m_hashTable + 0x20))(local_18,0x70,iVar1);
    local_288 = *(undefined8 **)(lVar4 + 8);
    for (local_28c = 0; local_28c < iVar1; local_28c = local_28c + 1) {
      ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),local_28c)
      ;
      iVar2 = (*(*ppJVar16)->_vptr_Joint[5])();
      *(int *)(local_288 + 0xd) = iVar2;
      ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),local_28c)
      ;
      btVector3::serializeFloat((*ppJVar16)->m_refs,(btVector3FloatData *)(local_288 + 2));
      ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),local_28c)
      ;
      btVector3::serializeFloat((*ppJVar16)->m_refs + 1,(btVector3FloatData *)(local_288 + 4));
      ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),local_28c)
      ;
      *(btScalar *)(local_288 + 6) = (*ppJVar16)->m_cfm;
      ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),local_28c)
      ;
      *(btScalar *)((long)local_288 + 0x34) = (*ppJVar16)->m_erp;
      ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),local_28c)
      ;
      *(btScalar *)(local_288 + 7) = (*ppJVar16)->m_split;
      ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),local_28c)
      ;
      *(uint *)((long)local_288 + 0x3c) = (uint)((*ppJVar16)->m_delete & 1);
      for (local_290 = 0; local_290 < 4; local_290 = local_290 + 1) {
        *(undefined4 *)((long)local_288 + (long)local_290 * 4 + 0x40) = 0;
        *(undefined4 *)((long)local_288 + (long)local_290 * 4 + 0x50) = 0;
      }
      *local_288 = 0;
      local_288[1] = 0;
      ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),local_28c)
      ;
      pbVar17 = local_18;
      if ((*ppJVar16)->m_bodies[0].m_soft != (Cluster *)0x0) {
        *(undefined4 *)(local_288 + 0xc) = 1;
        ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),
                              local_28c);
        uVar11 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))
                           (pbVar17,(*ppJVar16)->m_bodies[0].m_soft);
        *local_288 = uVar11;
      }
      ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),local_28c)
      ;
      pbVar17 = local_18;
      if ((*ppJVar16)->m_bodies[0].m_collisionObject != (btCollisionObject *)0x0) {
        *(undefined4 *)(local_288 + 0xc) = 3;
        ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),
                              local_28c);
        uVar11 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))
                           (pbVar17,(*ppJVar16)->m_bodies[0].m_collisionObject);
        *local_288 = uVar11;
      }
      ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),local_28c)
      ;
      pbVar17 = local_18;
      if ((*ppJVar16)->m_bodies[0].m_rigid != (btRigidBody *)0x0) {
        *(undefined4 *)(local_288 + 0xc) = 2;
        ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),
                              local_28c);
        uVar11 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))
                           (pbVar17,(*ppJVar16)->m_bodies[0].m_rigid);
        *local_288 = uVar11;
      }
      ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),local_28c)
      ;
      pbVar17 = local_18;
      if ((*ppJVar16)->m_bodies[1].m_soft != (Cluster *)0x0) {
        *(undefined4 *)((long)local_288 + 100) = 1;
        ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),
                              local_28c);
        uVar11 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))
                           (pbVar17,(*ppJVar16)->m_bodies[1].m_soft);
        local_288[1] = uVar11;
      }
      ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),local_28c)
      ;
      pbVar17 = local_18;
      if ((*ppJVar16)->m_bodies[1].m_collisionObject != (btCollisionObject *)0x0) {
        *(undefined4 *)((long)local_288 + 100) = 3;
        ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                             ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),
                              local_28c);
        uVar11 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))
                           (pbVar17,(*ppJVar16)->m_bodies[1].m_collisionObject);
        local_288[1] = uVar11;
      }
      ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),local_28c)
      ;
      if ((*ppJVar16)->m_bodies[1].m_rigid != (btRigidBody *)0x0) {
        *(undefined4 *)((long)local_288 + 100) = 2;
        pbVar17 = local_18;
        btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                  ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),local_28c);
        uVar11 = (**(code **)(*(long *)&pbVar17->m_hashTable + 0x38))();
        local_288[1] = uVar11;
      }
      local_288 = local_288 + 0xe;
    }
    ppJVar16 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Joint_*> *)(in_RDI + 0x450),0);
    (**(code **)(*(long *)&local_18->m_hashTable + 0x28))
              (local_18,lVar4,"btSoftBodyJointData",0x59415241,ppJVar16);
    in_stack_fffffffffffff550 = local_18;
  }
  btHashMap<btHashPtr,_int>::~btHashMap(in_stack_fffffffffffff550);
  return "btSoftBodyFloatData";
}

Assistant:

const char*	btSoftBody::serialize(void* dataBuffer, class btSerializer* serializer) const
{
	btSoftBodyData* sbd = (btSoftBodyData*) dataBuffer;

	btCollisionObject::serialize(&sbd->m_collisionObjectData, serializer);

	btHashMap<btHashPtr,int>	m_nodeIndexMap;

	sbd->m_numMaterials = m_materials.size();
	sbd->m_materials = sbd->m_numMaterials? (SoftBodyMaterialData**) serializer->getUniquePointer((void*)&m_materials): 0;

	if (sbd->m_materials)
	{
		int sz = sizeof(SoftBodyMaterialData*);
		int numElem = sbd->m_numMaterials;
		btChunk* chunk = serializer->allocate(sz,numElem);
		//SoftBodyMaterialData** memPtr = chunk->m_oldPtr;
		SoftBodyMaterialData** memPtr = (SoftBodyMaterialData**)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			btSoftBody::Material* mat = m_materials[i];
			*memPtr = mat ? (SoftBodyMaterialData*)serializer->getUniquePointer((void*)mat) : 0;
			if (!serializer->findPointer(mat))
			{
				//serialize it here
				btChunk* chunk = serializer->allocate(sizeof(SoftBodyMaterialData),1);
				SoftBodyMaterialData* memPtr = (SoftBodyMaterialData*)chunk->m_oldPtr;
				memPtr->m_flags = mat->m_flags;
				memPtr->m_angularStiffness = mat->m_kAST;
				memPtr->m_linearStiffness = mat->m_kLST;
				memPtr->m_volumeStiffness = mat->m_kVST;
				serializer->finalizeChunk(chunk,"SoftBodyMaterialData",BT_SBMATERIAL_CODE,mat);
			}
		}
		serializer->finalizeChunk(chunk,"SoftBodyMaterialData",BT_ARRAY_CODE,(void*) &m_materials);
	}


	

	sbd->m_numNodes = m_nodes.size();
	sbd->m_nodes = sbd->m_numNodes ? (SoftBodyNodeData*)serializer->getUniquePointer((void*)&m_nodes): 0;
	if (sbd->m_nodes)
	{
		int sz = sizeof(SoftBodyNodeData);
		int numElem = sbd->m_numNodes;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyNodeData* memPtr = (SoftBodyNodeData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			m_nodes[i].m_f.serializeFloat( memPtr->m_accumulatedForce);
			memPtr->m_area = m_nodes[i].m_area;
			memPtr->m_attach = m_nodes[i].m_battach;
			memPtr->m_inverseMass = m_nodes[i].m_im;
			memPtr->m_material = m_nodes[i].m_material? (SoftBodyMaterialData*)serializer->getUniquePointer((void*) m_nodes[i].m_material):0;
			m_nodes[i].m_n.serializeFloat(memPtr->m_normal);
			m_nodes[i].m_x.serializeFloat(memPtr->m_position);
			m_nodes[i].m_q.serializeFloat(memPtr->m_previousPosition);
			m_nodes[i].m_v.serializeFloat(memPtr->m_velocity);
			m_nodeIndexMap.insert(&m_nodes[i],i);
		}
		serializer->finalizeChunk(chunk,"SoftBodyNodeData",BT_SBNODE_CODE,(void*) &m_nodes);
	}

	sbd->m_numLinks = m_links.size();
	sbd->m_links = sbd->m_numLinks? (SoftBodyLinkData*) serializer->getUniquePointer((void*)&m_links[0]):0;
	if (sbd->m_links)
	{
		int sz = sizeof(SoftBodyLinkData);
		int numElem = sbd->m_numLinks;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyLinkData* memPtr = (SoftBodyLinkData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_bbending = m_links[i].m_bbending;
			memPtr->m_material = m_links[i].m_material? (SoftBodyMaterialData*)serializer->getUniquePointer((void*) m_links[i].m_material):0;
			memPtr->m_nodeIndices[0] = m_links[i].m_n[0] ? m_links[i].m_n[0] - &m_nodes[0]: -1;
			memPtr->m_nodeIndices[1] = m_links[i].m_n[1] ? m_links[i].m_n[1] - &m_nodes[0]: -1;
			btAssert(memPtr->m_nodeIndices[0]<m_nodes.size());
			btAssert(memPtr->m_nodeIndices[1]<m_nodes.size());
			memPtr->m_restLength = m_links[i].m_rl;
		}
		serializer->finalizeChunk(chunk,"SoftBodyLinkData",BT_ARRAY_CODE,(void*) &m_links[0]);

	}


	sbd->m_numFaces = m_faces.size();
	sbd->m_faces = sbd->m_numFaces? (SoftBodyFaceData*) serializer->getUniquePointer((void*)&m_faces[0]):0;
	if (sbd->m_faces)
	{
		int sz = sizeof(SoftBodyFaceData);
		int numElem = sbd->m_numFaces;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyFaceData* memPtr = (SoftBodyFaceData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_material = m_faces[i].m_material ?  (SoftBodyMaterialData*) serializer->getUniquePointer((void*)m_faces[i].m_material): 0;
			m_faces[i].m_normal.serializeFloat(	memPtr->m_normal);
			for (int j=0;j<3;j++)
			{
				memPtr->m_nodeIndices[j] = m_faces[i].m_n[j]? m_faces[i].m_n[j] - &m_nodes[0]: -1;
			}
			memPtr->m_restArea = m_faces[i].m_ra;
		}
		serializer->finalizeChunk(chunk,"SoftBodyFaceData",BT_ARRAY_CODE,(void*) &m_faces[0]);
	}


	sbd->m_numTetrahedra = m_tetras.size();
	sbd->m_tetrahedra = sbd->m_numTetrahedra ? (SoftBodyTetraData*) serializer->getUniquePointer((void*)&m_tetras[0]):0;
	if (sbd->m_tetrahedra)
	{
		int sz = sizeof(SoftBodyTetraData);
		int numElem = sbd->m_numTetrahedra;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyTetraData* memPtr = (SoftBodyTetraData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			for (int j=0;j<4;j++)
			{
				m_tetras[i].m_c0[j].serializeFloat(	memPtr->m_c0[j] );
				memPtr->m_nodeIndices[j] = m_tetras[j].m_n[j]? m_tetras[j].m_n[j]-&m_nodes[0] : -1;
			}
			memPtr->m_c1 = m_tetras[i].m_c1;
			memPtr->m_c2 = m_tetras[i].m_c2;
			memPtr->m_material = m_tetras[i].m_material ? (SoftBodyMaterialData*)serializer->getUniquePointer((void*) m_tetras[i].m_material): 0;
			memPtr->m_restVolume = m_tetras[i].m_rv;
		}
		serializer->finalizeChunk(chunk,"SoftBodyTetraData",BT_ARRAY_CODE,(void*) &m_tetras[0]);
	}

	sbd->m_numAnchors = m_anchors.size();
	sbd->m_anchors = sbd->m_numAnchors ? (SoftRigidAnchorData*) serializer->getUniquePointer((void*)&m_anchors[0]):0;
	if (sbd->m_anchors)
	{
		int sz = sizeof(SoftRigidAnchorData);
		int numElem = sbd->m_numAnchors;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftRigidAnchorData* memPtr = (SoftRigidAnchorData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			m_anchors[i].m_c0.serializeFloat(memPtr->m_c0);
			m_anchors[i].m_c1.serializeFloat(memPtr->m_c1);
			memPtr->m_c2 = m_anchors[i].m_c2;
			m_anchors[i].m_local.serializeFloat(memPtr->m_localFrame);
			memPtr->m_nodeIndex = m_anchors[i].m_node? m_anchors[i].m_node-&m_nodes[0]: -1;
			
			memPtr->m_rigidBody = m_anchors[i].m_body? (btRigidBodyData*)  serializer->getUniquePointer((void*)m_anchors[i].m_body): 0;
			btAssert(memPtr->m_nodeIndex < m_nodes.size());
		}
		serializer->finalizeChunk(chunk,"SoftRigidAnchorData",BT_ARRAY_CODE,(void*) &m_anchors[0]);
	}
	

	sbd->m_config.m_dynamicFriction = m_cfg.kDF;
	sbd->m_config.m_baumgarte = m_cfg.kVCF;
	sbd->m_config.m_pressure = m_cfg.kPR;
	sbd->m_config.m_aeroModel = this->m_cfg.aeromodel;
	sbd->m_config.m_lift = m_cfg.kLF;
	sbd->m_config.m_drag = m_cfg.kDG;
	sbd->m_config.m_positionIterations = m_cfg.piterations;
	sbd->m_config.m_driftIterations = m_cfg.diterations;
	sbd->m_config.m_clusterIterations = m_cfg.citerations;
	sbd->m_config.m_velocityIterations = m_cfg.viterations;
	sbd->m_config.m_maxVolume = m_cfg.maxvolume;
	sbd->m_config.m_damping = m_cfg.kDP;
	sbd->m_config.m_poseMatch = m_cfg.kMT;
	sbd->m_config.m_collisionFlags = m_cfg.collisions;
	sbd->m_config.m_volume = m_cfg.kVC;
	sbd->m_config.m_rigidContactHardness = m_cfg.kCHR;
	sbd->m_config.m_kineticContactHardness = m_cfg.kKHR;
	sbd->m_config.m_softContactHardness = m_cfg.kSHR;
	sbd->m_config.m_anchorHardness = m_cfg.kAHR;
	sbd->m_config.m_timeScale = m_cfg.timescale;
	sbd->m_config.m_maxVolume = m_cfg.maxvolume;
	sbd->m_config.m_softRigidClusterHardness = m_cfg.kSRHR_CL;
	sbd->m_config.m_softKineticClusterHardness = m_cfg.kSKHR_CL;
	sbd->m_config.m_softSoftClusterHardness = m_cfg.kSSHR_CL;
	sbd->m_config.m_softRigidClusterImpulseSplit = m_cfg.kSR_SPLT_CL;
	sbd->m_config.m_softKineticClusterImpulseSplit = m_cfg.kSK_SPLT_CL;
	sbd->m_config.m_softSoftClusterImpulseSplit = m_cfg.kSS_SPLT_CL;

	//pose for shape matching
	{
		sbd->m_pose = (SoftBodyPoseData*)serializer->getUniquePointer((void*)&m_pose);

		int sz = sizeof(SoftBodyPoseData);
		btChunk* chunk = serializer->allocate(sz,1);
		SoftBodyPoseData* memPtr = (SoftBodyPoseData*)chunk->m_oldPtr;
		
		m_pose.m_aqq.serializeFloat(memPtr->m_aqq);
		memPtr->m_bframe = m_pose.m_bframe;
		memPtr->m_bvolume = m_pose.m_bvolume;
		m_pose.m_com.serializeFloat(memPtr->m_com);
		
		memPtr->m_numPositions = m_pose.m_pos.size();
		memPtr->m_positions = memPtr->m_numPositions ? (btVector3FloatData*)serializer->getUniquePointer((void*)&m_pose.m_pos[0]): 0;
		if (memPtr->m_numPositions)
		{
			int numElem = memPtr->m_numPositions;
			int sz = sizeof(btVector3Data);
			btChunk* chunk = serializer->allocate(sz,numElem);
			btVector3FloatData* memPtr = (btVector3FloatData*)chunk->m_oldPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_pose.m_pos[i].serializeFloat(*memPtr);
			}
			serializer->finalizeChunk(chunk,"btVector3FloatData",BT_ARRAY_CODE,(void*)&m_pose.m_pos[0]);
		}
		memPtr->m_restVolume = m_pose.m_volume;
		m_pose.m_rot.serializeFloat(memPtr->m_rot);
		m_pose.m_scl.serializeFloat(memPtr->m_scale);

		memPtr->m_numWeigts = m_pose.m_wgh.size();
		memPtr->m_weights = memPtr->m_numWeigts? (float*) serializer->getUniquePointer((void*) &m_pose.m_wgh[0]) : 0;
		if (memPtr->m_numWeigts)
		{
			
			int numElem = memPtr->m_numWeigts;
			int sz = sizeof(float);
			btChunk* chunk = serializer->allocate(sz,numElem);
			float* memPtr = (float*) chunk->m_oldPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				*memPtr = m_pose.m_wgh[i];
			}
			serializer->finalizeChunk(chunk,"float",BT_ARRAY_CODE,(void*)&m_pose.m_wgh[0]);
		}

		serializer->finalizeChunk(chunk,"SoftBodyPoseData",BT_ARRAY_CODE,(void*)&m_pose);
	}

	//clusters for convex-cluster collision detection

	sbd->m_numClusters = m_clusters.size();
	sbd->m_clusters = sbd->m_numClusters? (SoftBodyClusterData*) serializer->getUniquePointer((void*)m_clusters[0]) : 0;
	if (sbd->m_numClusters)
	{
		int numElem = sbd->m_numClusters;
		int sz = sizeof(SoftBodyClusterData);
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyClusterData* memPtr = (SoftBodyClusterData*) chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_adamping= m_clusters[i]->m_adamping;
			m_clusters[i]->m_av.serializeFloat(memPtr->m_av);
			memPtr->m_clusterIndex = m_clusters[i]->m_clusterIndex;
			memPtr->m_collide = m_clusters[i]->m_collide;
			m_clusters[i]->m_com.serializeFloat(memPtr->m_com);
			memPtr->m_containsAnchor = m_clusters[i]->m_containsAnchor;
			m_clusters[i]->m_dimpulses[0].serializeFloat(memPtr->m_dimpulses[0]);
			m_clusters[i]->m_dimpulses[1].serializeFloat(memPtr->m_dimpulses[1]);
			m_clusters[i]->m_framexform.serializeFloat(memPtr->m_framexform);
			memPtr->m_idmass = m_clusters[i]->m_idmass;
			memPtr->m_imass = m_clusters[i]->m_imass;
			m_clusters[i]->m_invwi.serializeFloat(memPtr->m_invwi);
			memPtr->m_ldamping = m_clusters[i]->m_ldamping;
			m_clusters[i]->m_locii.serializeFloat(memPtr->m_locii);
			m_clusters[i]->m_lv.serializeFloat(memPtr->m_lv);
			memPtr->m_matching = m_clusters[i]->m_matching;
			memPtr->m_maxSelfCollisionImpulse = m_clusters[i]->m_maxSelfCollisionImpulse;
			memPtr->m_ndamping = m_clusters[i]->m_ndamping;
			memPtr->m_ldamping = m_clusters[i]->m_ldamping;
			memPtr->m_adamping = m_clusters[i]->m_adamping;
			memPtr->m_selfCollisionImpulseFactor = m_clusters[i]->m_selfCollisionImpulseFactor;

			memPtr->m_numFrameRefs = m_clusters[i]->m_framerefs.size();
			memPtr->m_numMasses = m_clusters[i]->m_masses.size();
			memPtr->m_numNodes = m_clusters[i]->m_nodes.size();

			memPtr->m_nvimpulses = m_clusters[i]->m_nvimpulses;
			m_clusters[i]->m_vimpulses[0].serializeFloat(memPtr->m_vimpulses[0]);
			m_clusters[i]->m_vimpulses[1].serializeFloat(memPtr->m_vimpulses[1]);
			memPtr->m_ndimpulses = m_clusters[i]->m_ndimpulses;

			

			memPtr->m_framerefs = memPtr->m_numFrameRefs? (btVector3FloatData*)serializer->getUniquePointer((void*)&m_clusters[i]->m_framerefs[0]) : 0;
			if (memPtr->m_framerefs)
			{
				int numElem = memPtr->m_numFrameRefs;
				int sz = sizeof(btVector3FloatData);
				btChunk* chunk = serializer->allocate(sz,numElem);
				btVector3FloatData* memPtr = (btVector3FloatData*) chunk->m_oldPtr;
				for (int j=0;j<numElem;j++,memPtr++)
				{
					m_clusters[i]->m_framerefs[j].serializeFloat(*memPtr);
				}
				serializer->finalizeChunk(chunk,"btVector3FloatData",BT_ARRAY_CODE,(void*)&m_clusters[i]->m_framerefs[0]);
			}
			
			memPtr->m_masses = memPtr->m_numMasses ? (float*) serializer->getUniquePointer((void*)&m_clusters[i]->m_masses[0]): 0;
			if (memPtr->m_masses)
			{
				int numElem = memPtr->m_numMasses;
				int sz = sizeof(float);
				btChunk* chunk = serializer->allocate(sz,numElem);
				float* memPtr = (float*) chunk->m_oldPtr;
				for (int j=0;j<numElem;j++,memPtr++)
				{
					*memPtr = m_clusters[i]->m_masses[j];
				}
				serializer->finalizeChunk(chunk,"float",BT_ARRAY_CODE,(void*)&m_clusters[i]->m_masses[0]);
			}

			memPtr->m_nodeIndices  = memPtr->m_numNodes ? (int*) serializer->getUniquePointer((void*) &m_clusters[i]->m_nodes) : 0;
			if (memPtr->m_nodeIndices )
			{
				int numElem = memPtr->m_numMasses;
				int sz = sizeof(int);
				btChunk* chunk = serializer->allocate(sz,numElem);
				int* memPtr = (int*) chunk->m_oldPtr;
				for (int j=0;j<numElem;j++,memPtr++)
				{
					int* indexPtr = m_nodeIndexMap.find(m_clusters[i]->m_nodes[j]);
					btAssert(indexPtr);
					*memPtr = *indexPtr;
				}
				serializer->finalizeChunk(chunk,"int",BT_ARRAY_CODE,(void*)&m_clusters[i]->m_nodes);
			}
		}
		serializer->finalizeChunk(chunk,"SoftBodyClusterData",BT_ARRAY_CODE,(void*)m_clusters[0]);

	}
	

	
	sbd->m_numJoints = m_joints.size();
	sbd->m_joints = m_joints.size()? (btSoftBodyJointData*) serializer->getUniquePointer((void*)&m_joints[0]) : 0;

	if (sbd->m_joints)
	{
		int sz = sizeof(btSoftBodyJointData);
		int numElem = m_joints.size();
		btChunk* chunk = serializer->allocate(sz,numElem);
		btSoftBodyJointData* memPtr = (btSoftBodyJointData*)chunk->m_oldPtr;

		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_jointType = (int)m_joints[i]->Type();
			m_joints[i]->m_refs[0].serializeFloat(memPtr->m_refs[0]);
			m_joints[i]->m_refs[1].serializeFloat(memPtr->m_refs[1]);
			memPtr->m_cfm = m_joints[i]->m_cfm;
			memPtr->m_erp = float(m_joints[i]->m_erp);
			memPtr->m_split = float(m_joints[i]->m_split);
			memPtr->m_delete = m_joints[i]->m_delete;
			
			for (int j=0;j<4;j++)
			{
				memPtr->m_relPosition[0].m_floats[j] = 0.f;
				memPtr->m_relPosition[1].m_floats[j] = 0.f;
			}
			memPtr->m_bodyA = 0;
			memPtr->m_bodyB = 0;
			if (m_joints[i]->m_bodies[0].m_soft)
			{
				memPtr->m_bodyAtype = BT_JOINT_SOFT_BODY_CLUSTER;
				memPtr->m_bodyA = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[0].m_soft);
			}
			if (m_joints[i]->m_bodies[0].m_collisionObject)
			{
				memPtr->m_bodyAtype = BT_JOINT_COLLISION_OBJECT;
				memPtr->m_bodyA = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[0].m_collisionObject);
			}
			if (m_joints[i]->m_bodies[0].m_rigid)
			{
				memPtr->m_bodyAtype = BT_JOINT_RIGID_BODY;
				memPtr->m_bodyA = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[0].m_rigid);
			}

			if (m_joints[i]->m_bodies[1].m_soft)
			{
				memPtr->m_bodyBtype = BT_JOINT_SOFT_BODY_CLUSTER;
				memPtr->m_bodyB = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[1].m_soft);
			}
			if (m_joints[i]->m_bodies[1].m_collisionObject)
			{
				memPtr->m_bodyBtype = BT_JOINT_COLLISION_OBJECT;
				memPtr->m_bodyB = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[1].m_collisionObject);
			}
			if (m_joints[i]->m_bodies[1].m_rigid)
			{
				memPtr->m_bodyBtype = BT_JOINT_RIGID_BODY;
				memPtr->m_bodyB = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[1].m_rigid);
			}
		}
		serializer->finalizeChunk(chunk,"btSoftBodyJointData",BT_ARRAY_CODE,(void*) &m_joints[0]);
	}


	return btSoftBodyDataName;
}